

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O1

string * __thiscall
LiteScript::_Type_CLASS::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_CLASS *this,Variable *object)

{
  Class *this_00;
  _Alloc_hider _Var1;
  int iVar2;
  uint uVar3;
  Object *pOVar4;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *pvVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  uint i;
  ulong uVar11;
  stringstream ss;
  string local_1e8;
  undefined1 local_1c8 [32];
  pointer local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
  pOVar4 = Variable::operator->(object);
  this_00 = (Class *)pOVar4->data;
  pvVar5 = Class::GetInherits(this_00);
  if ((pvVar5->super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (pvVar5->super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"inherits:[",10);
    uVar6 = (ulong)((long)(pvVar5->
                          super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar5->
                         super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 4;
    iVar2 = (int)uVar6;
    if (iVar2 != 0) {
      lVar10 = 0;
      uVar11 = 0;
      do {
        Variable::operator->
                  ((Variable *)
                   ((long)&((pvVar5->
                            super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                            )._M_impl.super__Vector_impl_data._M_start)->obj + lVar10));
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        if (uVar11 < iVar2 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x10;
      } while ((uVar6 & 0xffffffff) != uVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
    uVar3 = Class::GetStaticCount(this_00);
    if (uVar3 == 0) {
      uVar3 = Class::GetUnstaticCount(this_00);
      if (uVar3 == 0) goto LAB_0012460a;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
  }
LAB_0012460a:
  uVar3 = Class::GetStaticCount(this_00);
  iVar2 = (int)(ostream *)local_1a8;
  if (uVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"static:{",8);
    uVar3 = Class::GetStaticCount(this_00);
    if (uVar3 != 0) {
      uVar9 = 0;
      do {
        pcVar7 = Class::GetStaticName(this_00,uVar9);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)((long)&local_1a8[0][-1].first.field_2 + 8));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        Class::GetStaticMember((Class *)local_1c8,(uint)this_00);
        Variable::operator_cast_to_string(&local_1e8,(Variable *)local_1c8);
        _Var1._M_p = local_1e8._M_dataplus._M_p;
        if (local_1e8._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)((long)&local_1a8[0][-1].first.field_2 + 8));
        }
        else {
          sVar8 = strlen(local_1e8._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,_Var1._M_p,sVar8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        Variable::~Variable((Variable *)local_1c8);
        if (uVar9 < uVar3 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar3 != uVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
    uVar3 = Class::GetUnstaticCount(this_00);
    if (uVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
    }
  }
  uVar3 = Class::GetUnstaticCount(this_00);
  if (uVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"unstatic:{",10);
    uVar3 = Class::GetConstructorIndex(this_00);
    uVar9 = Class::GetUnstaticCount(this_00);
    if (uVar9 != 0) {
      i = 0;
      do {
        pcVar7 = Class::GetUnstaticName(this_00,i);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)((long)&local_1a8[0][-1].first.field_2 + 8));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar8);
        }
        pcVar7 = "";
        if (uVar3 == i) {
          pcVar7 = "(constructor)";
        }
        lVar10 = 0;
        if (uVar3 == i) {
          lVar10 = 0xd;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        Class::GetUnstaticMember((Class *)local_1c8,(uint)this_00);
        Variable::operator_cast_to_string(&local_1e8,(Variable *)local_1c8);
        _Var1._M_p = local_1e8._M_dataplus._M_p;
        if (local_1e8._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)((long)&local_1a8[0][-1].first.field_2 + 8));
        }
        else {
          sVar8 = strlen(local_1e8._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,_Var1._M_p,sVar8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        Variable::~Variable((Variable *)local_1c8);
        if (i < uVar9 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        }
        i = i + 1;
      } while (uVar9 != i);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_CLASS::ToString(const Variable &object) const {
    std::stringstream ss;
    ss << "{";
    const Class& C = object->GetData<Class>();
    const std::vector<LiteScript::Variable>& inherits = C.GetInherits();
    if (inherits.size() > 0) {
        ss << "inherits:[";
        for (unsigned int i = 0, sz = inherits.size(); i < sz; i++) {
            ss << inherits[i]->ID;
            if (i < sz - 1)
                ss << ",";
        }
        ss << "]";
        if (C.GetStaticCount() > 0 || C.GetUnstaticCount() > 0)
            ss << ",";
    }
    if (C.GetStaticCount() > 0) {
        ss << "static:{";
        for (unsigned int i = 0, sz = C.GetStaticCount(); i < sz; i++) {
            ss << C.GetStaticName(i) << ":" << ((std::string)C.GetStaticMember(i)).c_str();
            if (i < sz - 1)
                ss << ",";
        }
        ss << "}";
        if (C.GetUnstaticCount() > 0)
            ss << ",";
    }
    if (C.GetUnstaticCount() > 0) {
        ss << "unstatic:{";
        int construct = C.GetConstructorIndex();
        for (unsigned int i = 0, sz = C.GetUnstaticCount(); i < sz; i++) {
            ss << C.GetUnstaticName(i) << ((int)i == construct ? "(constructor)" : "") << ":" << ((std::string)C.GetUnstaticMember(i)).c_str();
            if (i < sz - 1)
                ss << ",";
        }
        ss << "}";
    }
    ss << "}";
    return ss.str();
}